

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress_block.c
# Opt level: O2

void ZSTD_initFseState(ZSTD_fseState *DStatePtr,BIT_DStream_t *bitD,ZSTD_seqSymbol *dt)

{
  uint uVar1;
  char *pcVar2;
  char *pcVar3;
  uint uVar4;
  
  uVar1 = dt->baseValue;
  if (uVar1 < 0x20) {
    uVar4 = bitD->bitsConsumed + uVar1;
    bitD->bitsConsumed = uVar4;
    DStatePtr->state = ~(-1L << ((byte)uVar1 & 0x3f)) & bitD->bitContainer >> (-(char)uVar4 & 0x3fU)
    ;
    if (uVar4 < 0x41) {
      pcVar2 = bitD->ptr;
      if (pcVar2 < bitD->limitPtr) {
        pcVar3 = bitD->start;
        if (pcVar2 != pcVar3) {
          uVar1 = (int)pcVar2 - (int)pcVar3;
          if (pcVar3 <= pcVar2 + -(ulong)(uVar4 >> 3)) {
            uVar1 = uVar4 >> 3;
          }
          bitD->ptr = pcVar2 + -(ulong)uVar1;
          bitD->bitsConsumed = uVar4 + uVar1 * -8;
          bitD->bitContainer = *(size_t *)(pcVar2 + -(ulong)uVar1);
        }
      }
      else {
        BIT_reloadDStreamFast(bitD);
      }
    }
    DStatePtr->table = dt + 1;
    return;
  }
  __assert_fail("nbBits < BIT_MASK_SIZE",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Utilities/cmzstd/lib/decompress/../common/bitstream.h"
                ,0x137,"size_t BIT_getMiddleBits(size_t, const U32, const U32)");
}

Assistant:

static void
ZSTD_initFseState(ZSTD_fseState* DStatePtr, BIT_DStream_t* bitD, const ZSTD_seqSymbol* dt)
{
    const void* ptr = dt;
    const ZSTD_seqSymbol_header* const DTableH = (const ZSTD_seqSymbol_header*)ptr;
    DStatePtr->state = BIT_readBits(bitD, DTableH->tableLog);
    DEBUGLOG(6, "ZSTD_initFseState : val=%u using %u bits",
                (U32)DStatePtr->state, DTableH->tableLog);
    BIT_reloadDStream(bitD);
    DStatePtr->table = dt + 1;
}